

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O3

void __thiscall OjaNewton::initialize_Z(OjaNewton *this,parameters *weights)

{
  sparse_parameters *psVar1;
  _func_void_weight_ptr_void_ptr *p_Var2;
  bool bVar3;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  byte bVar4;
  int iVar5;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> _Var6;
  weight *pwVar7;
  uint32_t i_1;
  ulong uVar8;
  ulong uVar9;
  OjaNewton *pOVar10;
  uint32_t i;
  ulong uVar11;
  long lVar12;
  float fVar13;
  weight wVar14;
  double dVar15;
  uint64_t index;
  ulong local_80;
  ulong local_78;
  float *local_70;
  double local_68;
  OjaNewton *local_60;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  ulong local_40;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_38;
  
  uVar8 = 1L << ((byte)this->all->num_bits & 0x3f);
  local_60 = this;
  if (this->normalize == true) {
    psVar1 = &weights->sparse_weights;
    uVar11 = 0;
    do {
      if (weights->sparse == true) {
        local_80 = uVar11 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f) &
                   (weights->sparse_weights)._weight_mask;
        _Var6._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)psVar1,&local_80);
        if (_Var6._M_cur == (__node_type *)0x0) {
          local_70 = calloc_or_throw<float>
                               (1L << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
          local_78 = local_80;
          std::
          _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<unsigned_long,float*>>
                    ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)psVar1,&local_78);
          _Var6._M_cur = (__node_type *)
                         std::
                         _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                 *)psVar1,&local_80);
          p_Var2 = (weights->sparse_weights).fun;
          if (p_Var2 != (_func_void_weight_ptr_void_ptr *)0x0) {
            (*p_Var2)(*(weight **)((long)_Var6._M_cur + 0x10),(weights->sparse_weights).default_data
                     );
          }
        }
        pwVar7 = *(weight **)
                  ((long)&((_Var6._M_cur)->
                          super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>).
                          super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                          _M_storage._M_storage + 8);
      }
      else {
        pwVar7 = (weights->dense_weights)._begin +
                 (uVar11 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
                 (weights->dense_weights)._weight_mask);
      }
      pwVar7[(long)local_60->m + 1] = 0.1;
      uVar11 = uVar11 + 1;
    } while (uVar8 != uVar11);
  }
  local_40 = uVar8 & 0xffffffff;
  if (local_60->random_init == false) {
    if (local_60->m < 1) {
      return;
    }
    psVar1 = &weights->sparse_weights;
    lVar12 = 1;
    do {
      if (weights->sparse == true) {
        local_80 = lVar12 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f) &
                   (weights->sparse_weights)._weight_mask;
        _Var6._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)psVar1,&local_80);
        if (_Var6._M_cur == (__node_type *)0x0) {
          local_70 = calloc_or_throw<float>
                               (1L << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
          local_78 = local_80;
          std::
          _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<unsigned_long,float*>>
                    ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)psVar1,&local_78);
          _Var6._M_cur = (__node_type *)
                         std::
                         _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                 *)psVar1,&local_80);
          p_Var2 = (weights->sparse_weights).fun;
          if (p_Var2 != (_func_void_weight_ptr_void_ptr *)0x0) {
            (*p_Var2)(*(weight **)((long)_Var6._M_cur + 0x10),(weights->sparse_weights).default_data
                     );
          }
        }
        pwVar7 = *(weight **)
                  ((long)&((_Var6._M_cur)->
                          super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>).
                          super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                          _M_storage._M_storage + 8);
      }
      else {
        pwVar7 = (weights->dense_weights)._begin +
                 (lVar12 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
                 (weights->dense_weights)._weight_mask);
      }
      pwVar7[lVar12] = 1.0;
      iVar5 = local_60->m;
      bVar3 = lVar12 < iVar5;
      lVar12 = lVar12 + 1;
    } while (bVar3);
  }
  else {
    local_38 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)&weights->sparse_weights;
    uVar8 = 0;
    pOVar10 = local_60;
    do {
      if (weights->sparse == true) {
        local_80 = uVar8 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f) &
                   (weights->sparse_weights)._weight_mask;
        _Var6._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find(local_38,&local_80);
        if (_Var6._M_cur == (__node_type *)0x0) {
          local_70 = calloc_or_throw<float>
                               (1L << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
          this_00 = local_38;
          local_78 = local_80;
          std::
          _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<unsigned_long,float*>>
                    ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)local_38,&local_78);
          _Var6._M_cur = (__node_type *)
                         std::
                         _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::find(this_00,&local_80);
          p_Var2 = (weights->sparse_weights).fun;
          if (p_Var2 != (_func_void_weight_ptr_void_ptr *)0x0) {
            (*p_Var2)(*(weight **)((long)_Var6._M_cur + 0x10),(weights->sparse_weights).default_data
                     );
          }
        }
        pwVar7 = *(weight **)
                  ((long)&((_Var6._M_cur)->
                          super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>).
                          super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                          _M_storage._M_storage + 8);
      }
      else {
        pwVar7 = (weights->dense_weights)._begin +
                 (uVar8 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
                 (weights->dense_weights)._weight_mask);
      }
      iVar5 = pOVar10->m;
      if (0 < iVar5) {
        lVar12 = 0;
        do {
          fVar13 = merand48(&pOVar10->all->random_state);
          local_68 = (double)CONCAT44(local_68._4_4_,fVar13);
          fVar13 = merand48(&pOVar10->all->random_state);
          local_58 = (double)CONCAT44(local_58._4_4_,fVar13);
          fVar13 = logf(local_68._0_4_);
          fVar13 = fVar13 * -2.0;
          if (fVar13 < 0.0) {
            fVar13 = sqrtf(fVar13);
          }
          else {
            fVar13 = SQRT(fVar13);
          }
          local_68 = (double)CONCAT44(local_68._4_4_,fVar13);
          dVar15 = cos((double)(float)local_58 * 6.2831854820251465);
          pwVar7[lVar12 + 1] = (float)dVar15 * local_68._0_4_;
          iVar5 = local_60->m;
          lVar12 = lVar12 + 1;
          pOVar10 = local_60;
        } while (lVar12 < iVar5);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != local_40);
  }
  if (0 < iVar5) {
    psVar1 = &weights->sparse_weights;
    uVar8 = 1;
    do {
      if (1 < uVar8) {
        uVar11 = 1;
        do {
          local_58 = 0.0;
          uVar9 = 0;
          do {
            bVar4 = weights->sparse;
            if ((bool)bVar4 == true) {
              local_80 = uVar9 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f) &
                         (weights->sparse_weights)._weight_mask;
              _Var6._M_cur = (__node_type *)
                             std::
                             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                     *)psVar1,&local_80);
              if (_Var6._M_cur == (__node_type *)0x0) {
                local_70 = calloc_or_throw<float>
                                     (1L << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
                local_78 = local_80;
                std::
                _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::_M_emplace<std::pair<unsigned_long,float*>>
                          ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)psVar1,&local_78);
                _Var6._M_cur = (__node_type *)
                               std::
                               _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                       *)psVar1,&local_80);
                p_Var2 = (weights->sparse_weights).fun;
                if (p_Var2 != (_func_void_weight_ptr_void_ptr *)0x0) {
                  (*p_Var2)(*(weight **)((long)_Var6._M_cur + 0x10),
                            (weights->sparse_weights).default_data);
                }
              }
              pwVar7 = *(weight **)
                        ((long)&((_Var6._M_cur)->
                                super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                                ).
                                super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                                ._M_storage._M_storage + 8);
              bVar4 = weights->sparse;
            }
            else {
              pwVar7 = (weights->dense_weights)._begin +
                       (uVar9 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
                       (weights->dense_weights)._weight_mask);
            }
            dVar15 = (double)pwVar7[uVar8];
            if ((bVar4 & 1) == 0) {
              pwVar7 = (weights->dense_weights)._begin +
                       (uVar9 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
                       (weights->dense_weights)._weight_mask);
            }
            else {
              local_80 = uVar9 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f) &
                         (weights->sparse_weights)._weight_mask;
              local_68 = dVar15;
              _Var6._M_cur = (__node_type *)
                             std::
                             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                     *)psVar1,&local_80);
              if (_Var6._M_cur == (__node_type *)0x0) {
                local_70 = calloc_or_throw<float>
                                     (1L << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
                local_78 = local_80;
                std::
                _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::_M_emplace<std::pair<unsigned_long,float*>>
                          ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)psVar1,&local_78);
                _Var6._M_cur = (__node_type *)
                               std::
                               _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                       *)psVar1,&local_80);
                p_Var2 = (weights->sparse_weights).fun;
                if (p_Var2 != (_func_void_weight_ptr_void_ptr *)0x0) {
                  (*p_Var2)(*(weight **)((long)_Var6._M_cur + 0x10),
                            (weights->sparse_weights).default_data);
                }
              }
              pwVar7 = *(weight **)
                        ((long)&((_Var6._M_cur)->
                                super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                                ).
                                super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                                ._M_storage._M_storage + 8);
              dVar15 = local_68;
            }
            local_58 = local_58 + dVar15 * (double)pwVar7[uVar11];
            uVar9 = uVar9 + 1;
          } while (local_40 != uVar9);
          local_58 = (double)CONCAT44(0x80000000,-(float)local_58);
          uStack_50 = 0x80000000;
          uStack_4c = 0x80000000;
          uVar9 = 0;
          do {
            bVar4 = weights->sparse;
            if ((bool)bVar4 == true) {
              local_80 = uVar9 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f) &
                         (weights->sparse_weights)._weight_mask;
              _Var6._M_cur = (__node_type *)
                             std::
                             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                     *)psVar1,&local_80);
              if (_Var6._M_cur == (__node_type *)0x0) {
                local_70 = calloc_or_throw<float>
                                     (1L << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
                local_78 = local_80;
                std::
                _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::_M_emplace<std::pair<unsigned_long,float*>>
                          ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)psVar1,&local_78);
                _Var6._M_cur = (__node_type *)
                               std::
                               _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                       *)psVar1,&local_80);
                p_Var2 = (weights->sparse_weights).fun;
                if (p_Var2 != (_func_void_weight_ptr_void_ptr *)0x0) {
                  (*p_Var2)(*(weight **)((long)_Var6._M_cur + 0x10),
                            (weights->sparse_weights).default_data);
                }
              }
              pwVar7 = *(weight **)
                        ((long)&((_Var6._M_cur)->
                                super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                                ).
                                super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                                ._M_storage._M_storage + 8);
              bVar4 = weights->sparse;
            }
            else {
              pwVar7 = (weights->dense_weights)._begin +
                       (uVar9 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
                       (weights->dense_weights)._weight_mask);
            }
            wVar14 = pwVar7[uVar11];
            if ((bVar4 & 1) == 0) {
              pwVar7 = (weights->dense_weights)._begin +
                       (uVar9 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
                       (weights->dense_weights)._weight_mask);
            }
            else {
              local_68 = (double)CONCAT44(local_68._4_4_,wVar14);
              local_80 = uVar9 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f) &
                         (weights->sparse_weights)._weight_mask;
              _Var6._M_cur = (__node_type *)
                             std::
                             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                     *)psVar1,&local_80);
              if (_Var6._M_cur == (__node_type *)0x0) {
                local_70 = calloc_or_throw<float>
                                     (1L << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
                local_78 = local_80;
                std::
                _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::_M_emplace<std::pair<unsigned_long,float*>>
                          ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)psVar1,&local_78);
                _Var6._M_cur = (__node_type *)
                               std::
                               _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                       *)psVar1,&local_80);
                p_Var2 = (weights->sparse_weights).fun;
                if (p_Var2 != (_func_void_weight_ptr_void_ptr *)0x0) {
                  (*p_Var2)(*(weight **)((long)_Var6._M_cur + 0x10),
                            (weights->sparse_weights).default_data);
                }
              }
              pwVar7 = *(weight **)
                        ((long)&((_Var6._M_cur)->
                                super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                                ).
                                super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                                ._M_storage._M_storage + 8);
              wVar14 = local_68._0_4_;
            }
            pwVar7[uVar8] = wVar14 * (float)local_58 + pwVar7[uVar8];
            uVar9 = uVar9 + 1;
          } while (local_40 != uVar9);
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar8);
      }
      dVar15 = 0.0;
      uVar11 = 0;
      do {
        bVar4 = weights->sparse;
        local_58 = dVar15;
        if ((bool)bVar4 == true) {
          local_80 = uVar11 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f) &
                     (weights->sparse_weights)._weight_mask;
          _Var6._M_cur = (__node_type *)
                         std::
                         _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                 *)psVar1,&local_80);
          if (_Var6._M_cur == (__node_type *)0x0) {
            local_70 = calloc_or_throw<float>
                                 (1L << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
            local_78 = local_80;
            std::
            _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::pair<unsigned_long,float*>>
                      ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)psVar1,&local_78);
            _Var6._M_cur = (__node_type *)
                           std::
                           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                   *)psVar1,&local_80);
            p_Var2 = (weights->sparse_weights).fun;
            if (p_Var2 != (_func_void_weight_ptr_void_ptr *)0x0) {
              (*p_Var2)(*(weight **)((long)_Var6._M_cur + 0x10),
                        (weights->sparse_weights).default_data);
            }
          }
          pwVar7 = *(weight **)
                    ((long)&((_Var6._M_cur)->
                            super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>).
                            super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                            _M_storage._M_storage + 8);
          bVar4 = weights->sparse;
        }
        else {
          pwVar7 = (weights->dense_weights)._begin +
                   (uVar11 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
                   (weights->dense_weights)._weight_mask);
        }
        dVar15 = (double)pwVar7[uVar8];
        if ((bVar4 & 1) == 0) {
          pwVar7 = (weights->dense_weights)._begin +
                   (uVar11 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
                   (weights->dense_weights)._weight_mask);
        }
        else {
          local_80 = uVar11 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f) &
                     (weights->sparse_weights)._weight_mask;
          local_68 = dVar15;
          _Var6._M_cur = (__node_type *)
                         std::
                         _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                 *)psVar1,&local_80);
          if (_Var6._M_cur == (__node_type *)0x0) {
            local_70 = calloc_or_throw<float>
                                 (1L << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
            local_78 = local_80;
            std::
            _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::pair<unsigned_long,float*>>
                      ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)psVar1,&local_78);
            _Var6._M_cur = (__node_type *)
                           std::
                           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                   *)psVar1,&local_80);
            p_Var2 = (weights->sparse_weights).fun;
            if (p_Var2 != (_func_void_weight_ptr_void_ptr *)0x0) {
              (*p_Var2)(*(weight **)((long)_Var6._M_cur + 0x10),
                        (weights->sparse_weights).default_data);
            }
          }
          pwVar7 = *(weight **)
                    ((long)&((_Var6._M_cur)->
                            super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>).
                            super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                            _M_storage._M_storage + 8);
          dVar15 = local_68;
        }
        dVar15 = local_58 + dVar15 * (double)pwVar7[uVar8];
        uVar11 = uVar11 + 1;
      } while (local_40 != uVar11);
      if (dVar15 < 0.0) {
        dVar15 = sqrt(dVar15);
      }
      else {
        dVar15 = SQRT(dVar15);
      }
      pOVar10 = local_60;
      fVar13 = (float)dVar15;
      uVar11 = 0;
      local_58 = (double)CONCAT44(local_58._4_4_,fVar13);
      do {
        if (weights->sparse == true) {
          local_80 = uVar11 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f) &
                     (weights->sparse_weights)._weight_mask;
          _Var6._M_cur = (__node_type *)
                         std::
                         _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                 *)psVar1,&local_80);
          if (_Var6._M_cur == (__node_type *)0x0) {
            local_70 = calloc_or_throw<float>
                                 (1L << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
            local_78 = local_80;
            std::
            _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::pair<unsigned_long,float*>>
                      ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)psVar1,&local_78);
            _Var6._M_cur = (__node_type *)
                           std::
                           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                   *)psVar1,&local_80);
            p_Var2 = (weights->sparse_weights).fun;
            if (p_Var2 != (_func_void_weight_ptr_void_ptr *)0x0) {
              (*p_Var2)(*(weight **)((long)_Var6._M_cur + 0x10),
                        (weights->sparse_weights).default_data);
            }
          }
          pwVar7 = *(weight **)
                    ((long)&((_Var6._M_cur)->
                            super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>).
                            super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                            _M_storage._M_storage + 8);
          fVar13 = (float)local_58;
        }
        else {
          pwVar7 = (weights->dense_weights)._begin +
                   (uVar11 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
                   (weights->dense_weights)._weight_mask);
        }
        pwVar7[uVar8] = pwVar7[uVar8] / fVar13;
        uVar11 = uVar11 + 1;
      } while (local_40 != uVar11);
      bVar3 = (long)uVar8 < (long)pOVar10->m;
      uVar8 = uVar8 + 1;
    } while (bVar3);
  }
  return;
}

Assistant:

void initialize_Z(parameters& weights)
  {
    uint32_t length = 1 << all->num_bits;
    if (normalize)  // initialize normalization part
    {
      for (uint32_t i = 0; i < length; i++) (&(weights.strided_index(i)))[NORM2] = 0.1f;
    }
    if (!random_init)
    {
      // simple initialization
      for (int i = 1; i <= m; i++) (&(weights.strided_index(i)))[i] = 1.f;
    }
    else
    {
      // more complicated initialization: orthgonal basis of a random matrix

      const double PI2 = 2.f * 3.1415927f;

      for (uint32_t i = 0; i < length; i++)
      {
        weight& w = weights.strided_index(i);
        for (int j = 1; j <= m; j++)
        {
          float r1 = merand48(all->random_state);
          float r2 = merand48(all->random_state);
          (&w)[j] = sqrt(-2.f * log(r1)) * (float)cos(PI2 * r2);
        }
      }
    }

    // Gram-Schmidt
    for (int j = 1; j <= m; j++)
    {
      for (int k = 1; k <= j - 1; k++)
      {
        double tmp = 0;

        for (uint32_t i = 0; i < length; i++)
          tmp += ((double)(&(weights.strided_index(i)))[j]) * (&(weights.strided_index(i)))[k];
        for (uint32_t i = 0; i < length; i++)
          (&(weights.strided_index(i)))[j] -= (float)tmp * (&(weights.strided_index(i)))[k];
      }
      double norm = 0;
      for (uint32_t i = 0; i < length; i++)
        norm += ((double)(&(weights.strided_index(i)))[j]) * (&(weights.strided_index(i)))[j];
      norm = sqrt(norm);
      for (uint32_t i = 0; i < length; i++) (&(weights.strided_index(i)))[j] /= (float)norm;
    }
  }